

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu_bar.cpp
# Opt level: O2

bool menu_bar_sub_item_active_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value cmd_value;
  Am_Object win;
  Am_Object cmd;
  Am_Object local_28;
  Am_Object owner;
  
  Am_Object::Get_Owner(&owner,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&owner);
  if (bVar1) {
    pAVar3 = Am_Object::Get(&owner,0xcc,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (!bVar1) {
      bVar1 = false;
      goto LAB_0026a451;
    }
  }
  win.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(self,0x68,0);
  Am_Object::operator=(&win,pAVar3);
  bVar1 = Am_Object::Valid(&win);
  if (bVar1) {
    cmd_value.type = 0;
    cmd_value._2_6_ = 0;
    pAVar3 = Am_Object::Get(&win,0x1d3,0);
    Am_Object::operator=((Am_Object *)&cmd_value,pAVar3);
    bVar1 = Am_Object::Valid((Am_Object *)&cmd_value);
    if (!bVar1) {
LAB_0026a3a2:
      Am_Object::~Am_Object((Am_Object *)&cmd_value);
      goto LAB_0026a3aa;
    }
    pAVar3 = Am_Object::Get((Am_Object *)&cmd_value,0xcc,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    if (bVar1) goto LAB_0026a3a2;
    Am_Object::~Am_Object((Am_Object *)&cmd_value);
    bVar1 = false;
  }
  else {
LAB_0026a3aa:
    pAVar3 = Am_Object::Get(self,0xc5,1);
    Am_Value::Am_Value(&cmd_value,pAVar3);
    if (cmd_value.type == 0xa001) {
      Am_Object::Am_Object(&cmd,&cmd_value);
      Am_Object::Am_Object(&local_28,&Am_Command);
      bVar2 = Am_Object::Is_Instance_Of(&cmd,&local_28);
      Am_Object::~Am_Object(&local_28);
      if (bVar2) {
        pAVar3 = Am_Object::Get(&cmd,0xcc,0);
        bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
      }
      else {
        bVar1 = false;
      }
      Am_Object::~Am_Object(&cmd);
      if (!bVar2) goto LAB_0026a43d;
    }
    else {
LAB_0026a43d:
      bVar1 = true;
    }
    Am_Value::~Am_Value(&cmd_value);
  }
  Am_Object::~Am_Object(&win);
LAB_0026a451:
  Am_Object::~Am_Object(&owner);
  return bVar1;
}

Assistant:

Am_Define_Formula(bool, menu_bar_sub_item_active)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && !(bool)owner.Get(Am_ACTIVE))
    return false;
  // now check the main-item I am attached to, if any
  Am_Object win;
  win = self.Get(Am_WINDOW);
  if (win.Valid()) {
    Am_Object main_item;
    main_item = win.Get(Am_FOR_ITEM);
    if (main_item.Valid() && !(bool)main_item.Get(Am_ACTIVE))
      return false;
  }
  //now check my command object, if any
  //   Am_Object cmd = self.GV_Object(Am_COMMAND);
  //   if( cmd.Valid() && cmd.Is_Instance_Of(Am_Command) )
  //     return cmd.GV(Am_ACTIVE);
  //   else
  //     return true;
  Am_Value cmd_value = self.Peek(Am_COMMAND);
  if (cmd_value.type == Am_OBJECT) {
    Am_Object cmd = cmd_value;
    if (cmd.Is_Instance_Of(Am_Command))
      return cmd.Get(Am_ACTIVE);
  }
  return true;
}